

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.h
# Opt level: O0

void __thiscall iqxmlrpc::Executor_factory_base::Executor_factory_base(Executor_factory_base *this)

{
  Executor_factory_base *this_local;
  
  this->_vptr_Executor_factory_base = (_func_int **)&PTR__Executor_factory_base_002522d0;
  return;
}

Assistant:

class LIBIQXMLRPC_API Executor_factory_base {
public:
  virtual ~Executor_factory_base() {}

  virtual Executor* create(
    Method*,
    Server*,
    Server_connection*
  ) = 0;

  virtual iqnet::Reactor_base* create_reactor() = 0;
}